

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O3

void __thiscall duckdb::CatalogEntryMap::DropEntry(CatalogEntryMap *this,CatalogEntry *entry)

{
  long *plVar1;
  pointer pcVar2;
  iterator iVar3;
  pointer pCVar4;
  InternalException *this_00;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> _Var5;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> _Var6;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar3 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
                  *)this,&entry->name);
  if (((_Rb_tree_header *)iVar3._M_node == &(this->entries)._M_t._M_impl.super__Rb_tree_header) ||
     (*(long *)(iVar3._M_node + 2) == 0)) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "Attempting to drop entry with name \"%s\" but no chain with that name exists","");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    pcVar2 = (entry->name)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,pcVar2 + (entry->name)._M_string_length);
    InternalException::InternalException<std::__cxx11::string>(this_00,&local_68,&local_48);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  _Var5._M_head_impl =
       (entry->child).
       super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
       super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
       super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
  if (_Var5._M_head_impl != (CatalogEntry *)0x0) {
    pCVar4 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
             operator->(&entry->child);
    (pCVar4->parent).ptr = (CatalogEntry *)0x0;
    _Var5._M_head_impl =
         (entry->child).
         super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
         super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
         super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
  }
  (entry->child).super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
  _M_t.super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
  super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl = (CatalogEntry *)0x0;
  if ((entry->parent).ptr == (CatalogEntry *)0x0) {
    iVar3 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
                    *)this,&entry->name);
    plVar1 = *(long **)(iVar3._M_node + 2);
    *(undefined8 *)(iVar3._M_node + 2) = 0;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    if (_Var5._M_head_impl == (CatalogEntry *)0x0) {
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
      ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
                      *)this,(const_iterator)iVar3._M_node);
      return;
    }
    _Var6._M_head_impl = *(CatalogEntry **)(iVar3._M_node + 2);
    *(CatalogEntry **)(iVar3._M_node + 2) = _Var5._M_head_impl;
  }
  else {
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&entry->parent);
    local_70._M_head_impl = _Var5._M_head_impl;
    CatalogEntry::SetChild
              ((entry->parent).ptr,
               (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
               &local_70);
    _Var6._M_head_impl = local_70._M_head_impl;
  }
  if (_Var6._M_head_impl != (CatalogEntry *)0x0) {
    (*(_Var6._M_head_impl)->_vptr_CatalogEntry[1])();
    return;
  }
  return;
}

Assistant:

void CatalogEntryMap::DropEntry(CatalogEntry &entry) {
	auto &name = entry.name;
	auto chain = GetEntry(name);
	if (!chain) {
		throw InternalException("Attempting to drop entry with name \"%s\" but no chain with that name exists", name);
	}
	auto child = entry.TakeChild();
	if (!entry.HasParent()) {
		// This is the top of the chain
		D_ASSERT(chain.get() == &entry);
		auto it = entries.find(name);
		D_ASSERT(it != entries.end());

		// Remove the entry
		it->second.reset();
		if (child) {
			// Replace it with its child
			it->second = std::move(child);
		} else {
			entries.erase(it);
		}
	} else {
		// Just replace the entry with its child
		auto &parent = entry.Parent();
		parent.SetChild(std::move(child));
	}
}